

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O0

void __thiscall dense_parameters::share(dense_parameters *this,size_t length)

{
  void *__dest;
  long in_RSI;
  undefined8 *in_RDI;
  weight *dest;
  size_t float_count;
  float *shared_weights;
  
  __dest = mmap64((void *)0x0,(in_RSI << ((byte)*(undefined4 *)(in_RDI + 2) & 0x3f)) << 2,3,0x21,-1,
                  0);
  memcpy(__dest,(void *)*in_RDI,(in_RSI << ((byte)*(undefined4 *)(in_RDI + 2) & 0x3f)) << 2);
  free((void *)*in_RDI);
  *in_RDI = __dest;
  return;
}

Assistant:

void share(size_t length)
  {
    float* shared_weights = (float*)mmap(
        0, (length << _stride_shift) * sizeof(float), PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANONYMOUS, -1, 0);
    size_t float_count = length << _stride_shift;
    weight* dest = shared_weights;
    memcpy(dest, _begin, float_count * sizeof(float));
    free(_begin);
    _begin = dest;
  }